

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

wchar_t borg_defend_aux_banishment_morgoth(void)

{
  loc grid1;
  loc grid1_00;
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_kill *pbVar5;
  char *what;
  monster_race *tmp_r_ptr;
  borg_kill *tmp_kill;
  monster_race *r_ptr;
  borg_kill *kill;
  uint local_18;
  _Bool banishment;
  wchar_t wStack_14;
  _Bool banish_evil;
  wchar_t count;
  wchar_t i;
  wchar_t fail_allowed;
  
  if (morgoth_on_level) {
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      _Var1 = borg_spell_okay_fail(BANISH_EVIL,0x32);
      _Var2 = borg_spell_okay_fail(MASS_BANISHMENT,0x32);
      if ((_Var2) || (_Var1)) {
        if ((borg_kills_cnt == 0) && ((borg_simulate & 1U) != 0)) {
          i = L'\0';
        }
        else {
          local_18 = 0;
          for (wStack_14 = 1; wStack_14 < borg_kills_nxt; wStack_14 = wStack_14 + 1) {
            pbVar5 = borg_kills + wStack_14;
            if ((((pbVar5->r_idx != 0) && ((int)(uint)pbVar5->r_idx < (int)(z_info->r_max - 1))) &&
                ((borg_t + -2 <= (int)pbVar5->when &&
                 (((!_Var1 || (_Var2)) ||
                  (_Var3 = flag_has_dbg(r_info[pbVar5->r_idx].flags,0xb,0x3d,"r_ptr->flags",
                                        "RF_EVIL"), _Var3)))))) &&
               ((grid1.y = borg.c.y, grid1.x = borg.c.x, wVar4 = distance(grid1,pbVar5->pos),
                wVar4 <= (int)(uint)z_info->max_range &&
                (_Var3 = borg_projectable(borg.c.y,borg.c.x,(pbVar5->pos).y,(pbVar5->pos).x), _Var3)
                ))) {
              grid1_00.y = borg.c.y;
              grid1_00.x = borg.c.x;
              wVar4 = distance(grid1_00,pbVar5->pos);
              if (wVar4 < L'\b') {
                local_18 = local_18 + 1;
              }
              local_18 = local_18 + 1;
            }
          }
          if (((int)local_18 < 8) && ((borg_simulate & 1U) != 0)) {
            i = L'\0';
          }
          else if ((borg_simulate & 1U) == 0) {
            what = format("# Attempting to cast Banishment for depth 100.  %d monsters ",
                          (ulong)local_18);
            borg_note(what);
            _Var1 = borg_spell(MASS_BANISHMENT);
            if ((_Var1) || (_Var1 = borg_spell(BANISH_EVIL), _Var1)) {
              for (wStack_14 = L'\0'; wStack_14 < borg_kills_nxt; wStack_14 = wStack_14 + L'\x01') {
                pbVar5 = borg_kills + wStack_14;
                if (((pbVar5->r_idx != 0) && ((int)(uint)pbVar5->r_idx < (int)(z_info->r_max - 1)))
                   && (_Var1 = flag_has_dbg(r_info[pbVar5->r_idx].flags,0xb,1,"tmp_r_ptr->flags",
                                            "RF_UNIQUE"), !_Var1)) {
                  borg_delete_kill(wStack_14);
                }
              }
              i = L'Ϩ';
            }
            else {
              i = L'\0';
            }
          }
          else {
            i = L'ל';
          }
        }
      }
      else {
        i = L'\0';
      }
    }
    else {
      i = L'\0';
    }
  }
  else {
    i = L'\0';
  }
  return i;
}

Assistant:

static int borg_defend_aux_banishment_morgoth(void)
{
    int fail_allowed = 50;
    int i;
    int count;
    bool banish_evil;
    bool banishment;

    borg_kill           *kill;
    struct monster_race *r_ptr;

    /* Not if Morgoth is not on this level */
    if (!morgoth_on_level)
        return 0;

    /* Cant when screwed */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISFORGET])
        return 0;

#if 0
    int x, y;
    borg_grid *ag;
    int glyphs = 0;

    /* Scan grids looking for glyphs */
    for (i = 0; i < 8; i++) {
        /* Access offset */
        x = borg.c.x + ddx_ddd[i];
        y = borg.c.y + ddy_ddd[i];

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Check for Glyphs */
        if (ag->glyph)
            glyphs++;
    }

    /* Only if on level 100 and in a sea of runes or
     * in the process of building one
     */
    if (!borg_morgoth_position && glyphs < 3) return 0;
#endif

    banish_evil = borg_spell_okay_fail(BANISH_EVIL, fail_allowed);
    banishment = borg_spell_okay_fail(MASS_BANISHMENT, fail_allowed);

    /* Do I have the spell? (Banish Evil) */
    if (!banishment && !banish_evil)
        return 0;

    /* Nobody around so dont worry */
    if (!borg_kills_cnt && borg_simulate)
        return 0;

    /* Find "nearby" monsters */
    count = 0;
    for (i = 1; i < borg_kills_nxt; i++) {
        /* Monster */
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* "player ghosts" */
        if (kill->r_idx >= z_info->r_max - 1)
            continue;

        r_ptr = &r_info[kill->r_idx];

        /* Require current knowledge */
        if (kill->when < borg_t - 2)
            continue;

        /* Never try on non-evil guys if doing banish evil */
        if (banish_evil && !banishment && !(rf_has(r_ptr->flags, RF_EVIL)))
            continue;

        /* Check the distance  */
        if (distance(borg.c, kill->pos) > z_info->max_range)
            continue;

        /* Monster must be LOS */
        if (!borg_projectable(borg.c.y, borg.c.x, kill->pos.y, kill->pos.x))
            continue;

        /* Count the number of monsters too close double*/
        if (distance(borg.c, kill->pos) <= 7)
            count++;

        /* Count the number of monster on screen */
        count++;
    }

    /* No destinations */
    if (count <= 7 && borg_simulate)
        return 0;

    /* Return a good score to make him do it */
    if (borg_simulate)
        return (1500);

    borg_note(format(
        "# Attempting to cast Banishment for depth 100.  %d monsters ", count));

    /* Cast the spell */
    if (borg_spell(MASS_BANISHMENT) || borg_spell(BANISH_EVIL)) {
        /* Remove this race from the borg_kill */
        for (i = 0; i < borg_kills_nxt; i++) {
            borg_kill           *tmp_kill;
            struct monster_race *tmp_r_ptr;

            /* Monster */
            tmp_kill  = &borg_kills[i];

            /* dead monsters or "player ghosts" */
            if (tmp_kill->r_idx == 0 || tmp_kill->r_idx >= z_info->r_max - 1)
                continue;

            tmp_r_ptr = &r_info[tmp_kill->r_idx];

            /* Cant kill uniques like this */
            if (rf_has(tmp_r_ptr->flags, RF_UNIQUE))
                continue;

            /* remove this monster */
            borg_delete_kill(i);
        }

        /* Value */
        return 1000;
    }

    return 0;
}